

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  TestInfo *pTVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  int iVar4;
  UnitTestImpl *pUVar5;
  int *piVar6;
  void *__addr;
  long lVar7;
  size_t __len;
  allocator<char> local_2ed;
  int local_2ec;
  bool result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  int pipe_fd [2];
  unique_ptr<char_*[],_std::default_delete<char_*[]>_> argv;
  int death_test_index;
  string local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ExecDeathTestArgs args_2;
  sigaction saved_sigprof_action;
  sigaction ignore_sigprof_action;
  string internal_flag;
  string filter_flag;
  
  pUVar5 = GetUnitTestImpl();
  pTVar1 = pUVar5->current_test_info_;
  pIVar2 = (pUVar5->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  death_test_index = (pTVar1->result_).death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(pipe_fd);
  if (iVar3 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"CHECK failed: File ",(allocator<char> *)&local_228);
    std::operator+(&local_2a8,&local_288,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a8,", line ");
    local_248._M_dataplus._M_p._0_4_ = 0x550;
    StreamableToString<int>(&local_268,(int *)&local_248);
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,&local_2c8,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &saved_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,"pipe(pipe_fd) != -1");
    DeathTestAbort((string *)&saved_sigprof_action);
  }
  iVar3 = fcntl(pipe_fd[1],2,0);
  if (iVar3 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"CHECK failed: File ",(allocator<char> *)&local_228);
    std::operator+(&local_2a8,&local_288,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a8,", line ");
    local_248._M_dataplus._M_p._0_4_ = 0x553;
    StreamableToString<int>(&local_268,(int *)&local_248);
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,&local_2c8,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &saved_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    DeathTestAbort((string *)&saved_sigprof_action);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"--",(allocator<char> *)&local_288);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_2a8,"gtest_");
  std::operator+(&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "filter=");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,&local_2c8,(pTVar1->test_suite_name_)._M_dataplus._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,".");
  std::operator+(&filter_flag,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,(pTVar1->name_)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&saved_sigprof_action);
  std::__cxx11::string::~string((string *)&ignore_sigprof_action);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"--",(allocator<char> *)&argv);
  std::operator+(&local_248,&local_228,"gtest_");
  std::operator+(&local_268,&local_248,"internal_run_death_test=");
  std::operator+(&local_288,&local_268,this->file_);
  std::operator+(&local_2a8,&local_288,"|");
  StreamableToString<int>(&local_1f0,&this->line_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_2a8,&local_1f0);
  std::operator+(&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,"|");
  StreamableToString<int>((string *)&args,&death_test_index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,"|");
  StreamableToString<int>((string *)&args_2,pipe_fd + 1);
  std::operator+(&internal_flag,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &saved_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_2);
  std::__cxx11::string::~string((string *)&args_2);
  std::__cxx11::string::~string((string *)&saved_sigprof_action);
  std::__cxx11::string::~string((string *)&ignore_sigprof_action);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&args,&filter_flag);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&args,&internal_flag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&saved_sigprof_action,"",(allocator<char> *)&ignore_sigprof_action);
  DeathTest::set_last_death_test_message((string *)&saved_sigprof_action);
  std::__cxx11::string::~string((string *)&saved_sigprof_action);
  CaptureStderr();
  FlushInfoLog();
  CreateArgvFromArgs((internal *)&argv,&args);
  args_2.argv = (char **)argv._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>.
                         _M_t.super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
                         super__Head_base<0UL,_char_**,_false>._M_head_impl;
  args_2.close_fd = pipe_fd[0];
  memset((sigaction *)&ignore_sigprof_action,0,0x98);
  sigemptyset((sigset_t *)&ignore_sigprof_action.sa_mask);
  ignore_sigprof_action.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  while (iVar3 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action,
                           (sigaction *)&saved_sigprof_action), iVar3 == -1) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"CHECK failed: File ",&local_2ed);
      std::operator+(&local_248,&local_228,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_268,&local_248,", line ");
      local_2ec = 0x50e;
      StreamableToString<int>(&local_1f0,&local_2ec);
      std::operator+(&local_288,&local_268,&local_1f0);
      std::operator+(&local_2a8,&local_288,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_2a8,"sigaction(SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)")
      ;
      std::operator+(&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     " != -1");
      DeathTestAbort(&local_2c8);
    }
  }
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_001111b4;
  }
  else {
    iVar3 = fork();
    if (iVar3 != 0) goto LAB_00110d32;
    ExecDeathTestChildMain(&args_2);
LAB_001111b4:
    iVar3 = __cxa_guard_acquire();
    if (iVar3 != 0) {
      StackLowerThanAddress(&local_2c8,&result);
      ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = result;
      __cxa_guard_release();
    }
  }
  iVar3 = getpagesize();
  __len = (size_t)(iVar3 * 2);
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  if (__addr == (void *)0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"CHECK failed: File ",(allocator<char> *)&local_2ec);
    std::operator+(&local_268,&local_248,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_288,&local_268,", line ");
    local_1f0._M_dataplus._M_p._0_4_ = 0x51a;
    StreamableToString<int>(&local_228,(int *)&local_1f0);
    std::operator+(&local_2a8,&local_288,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a8,": ");
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   "stack != MAP_FAILED");
    DeathTestAbort(&local_2c8);
  }
  lVar7 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar7 = __len - 0x40;
  }
  if (((uint)(iVar3 * 2) < 0x41) || (((ulong)(lVar7 + (long)__addr) & 0x3f) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"CHECK failed: File ",(allocator<char> *)&local_2ec);
    std::operator+(&local_268,&local_248,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_288,&local_268,", line ");
    local_1f0._M_dataplus._M_p._0_4_ = 0x528;
    StreamableToString<int>(&local_228,(int *)&local_1f0);
    std::operator+(&local_2a8,&local_288,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a8,": ");
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                  );
    DeathTestAbort(&local_2c8);
  }
  iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar7 + (long)__addr),0x11,&args_2);
  iVar4 = munmap(__addr,__len);
  if (iVar4 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"CHECK failed: File ",(allocator<char> *)&local_2ec);
    std::operator+(&local_268,&local_248,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_288,&local_268,", line ");
    local_1f0._M_dataplus._M_p._0_4_ = 0x52c;
    StreamableToString<int>(&local_228,(int *)&local_1f0);
    std::operator+(&local_2a8,&local_288,&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a8,": ");
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   "munmap(stack, stack_size) != -1");
    DeathTestAbort(&local_2c8);
  }
LAB_00110d32:
  while (iVar4 = sigaction(0x1b,(sigaction *)&saved_sigprof_action,(sigaction *)0x0), iVar4 == -1) {
    piVar6 = __errno_location();
    if (*piVar6 != 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"CHECK failed: File ",&local_2ed);
      std::operator+(&local_248,&local_228,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_268,&local_248,", line ");
      local_2ec = 0x538;
      StreamableToString<int>(&local_1f0,&local_2ec);
      std::operator+(&local_288,&local_268,&local_1f0);
      std::operator+(&local_2a8,&local_288,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     &local_2a8,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
      std::operator+(&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                     " != -1");
      DeathTestAbort(&local_2c8);
    }
  }
  if (iVar3 != -1) {
    do {
      iVar4 = close(pipe_fd[1]);
      if (iVar4 != -1) {
        *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::~unique_ptr(&argv);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args);
        std::__cxx11::string::~string((string *)&internal_flag);
        std::__cxx11::string::~string((string *)&filter_flag);
        return OVERSEE_TEST;
      }
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"CHECK failed: File ",(allocator<char> *)&local_1f0);
    std::operator+(&local_288,&local_268,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_2a8,&local_288,", line ");
    local_228._M_dataplus._M_p._0_4_ = 0x56a;
    StreamableToString<int>(&local_248,(int *)&local_228);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a8,&local_248);
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,": "
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,&local_2c8,"close(pipe_fd[1])");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &saved_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action," != -1");
    DeathTestAbort((string *)&saved_sigprof_action);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"CHECK failed: File ",(allocator<char> *)&local_2ec);
  std::operator+(&local_268,&local_248,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_288,&local_268,", line ");
  local_1f0._M_dataplus._M_p._0_4_ = 0x53b;
  StreamableToString<int>(&local_228,(int *)&local_1f0);
  std::operator+(&local_2a8,&local_288,&local_228);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_2a8,": ");
  std::operator+(&local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "child_pid != -1");
  DeathTestAbort(&local_2c8);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::unique_ptr<char*[]> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.get(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}